

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * printfTempBuf(sqlite3_str *pAccum,sqlite3_int64 n)

{
  u8 eError;
  char *pcVar1;
  
  if (pAccum->accError != '\0') {
    return (char *)0x0;
  }
  if ((n <= (long)(ulong)pAccum->nAlloc) || (eError = '\x12', (ulong)n <= (ulong)pAccum->mxAlloc)) {
    pcVar1 = (char *)sqlite3DbMallocRaw(pAccum->db,n);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    eError = '\a';
  }
  setStrAccumError(pAccum,eError);
  return (char *)0x0;
}

Assistant:

static char *printfTempBuf(sqlite3_str *pAccum, sqlite3_int64 n){
  char *z;
  if( pAccum->accError ) return 0;
  if( n>pAccum->nAlloc && n>pAccum->mxAlloc ){
    setStrAccumError(pAccum, SQLITE_TOOBIG);
    return 0;
  }
  z = sqlite3DbMallocRaw(pAccum->db, n);
  if( z==0 ){
    setStrAccumError(pAccum, SQLITE_NOMEM);
  }
  return z;
}